

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool convert<float,short>(TWaveformT<float> *src,TWaveformT<short> *dst)

{
  pointer pfVar1;
  pointer psVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  std::vector<short,_std::allocator<short>_>::resize
            (dst,(long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  pfVar1 = (src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = (ulong)((long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar1) >> 2;
  dVar6 = 0.0;
  uVar3 = (uint)uVar4;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    dVar7 = 0.0;
    do {
      dVar6 = (double)ABS(pfVar1[uVar5]);
      if ((double)ABS(pfVar1[uVar5]) <= dVar7) {
        dVar6 = dVar7;
      }
      uVar5 = uVar5 + 1;
      dVar7 = dVar6;
    } while ((uVar3 & 0x7fffffff) != uVar5);
  }
  if (0 < (int)uVar3) {
    psVar2 = (dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      dVar7 = round((double)pfVar1[uVar5] *
                    (double)(~-(ulong)(dVar6 != 0.0) & 0x3ff0000000000000 |
                            (ulong)(1.0 / dVar6) & -(ulong)(dVar6 != 0.0)) * 32767.0);
      psVar2[uVar5] = (short)(int)dVar7;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0xffffffff) != uVar5);
  }
  return true;
}

Assistant:

bool convert(const TWaveformT<TSampleSrc> & src, TWaveformT<TSampleDst> & dst) {
    static_assert(std::is_same<TSampleSrc, TSampleDst>::value == false, "Required different sample types");

    static_assert(std::is_same<TSampleSrc, TSampleF>::value, "Source sample type not supported");
    static_assert(std::is_same<TSampleDst, TSampleI16>::value, "Destination sample type not supported");

    dst.resize(src.size());

    double amax = calcAbsMax(src);
    double iamax = amax != 0.0 ? 1.0/amax : 1.0;
    for (auto i = 0; i < (int) src.size(); ++i) dst[i] = std::round(std::numeric_limits<TSampleDst>::max()*(src[i]*iamax));

    return true;
}